

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O0

void Io_WriteVerilogLatches(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int local_24;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    fprintf((FILE *)pFile,"  always @ (posedge clock) begin\n");
    for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_24);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_ObjFanout0(pAVar2);
        pAVar3 = Abc_ObjFanout0(pAVar3);
        pcVar4 = Abc_ObjName(pAVar3);
        pcVar4 = Io_WriteVerilogGetName(pcVar4);
        fprintf((FILE *)pFile,"    %s",pcVar4);
        pAVar2 = Abc_ObjFanin0(pAVar2);
        pAVar2 = Abc_ObjFanin0(pAVar2);
        pcVar4 = Abc_ObjName(pAVar2);
        pcVar4 = Io_WriteVerilogGetName(pcVar4);
        fprintf((FILE *)pFile," <= %s;\n",pcVar4);
      }
    }
    fprintf((FILE *)pFile,"  end\n");
    for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_24);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if ((iVar1 != 0) &&
         ((iVar1 = Abc_LatchInit(pAVar2), iVar1 == 1 || (iVar1 = Abc_LatchInit(pAVar2), iVar1 == 2))
         )) break;
    }
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (local_24 != iVar1) {
      fprintf((FILE *)pFile,"  initial begin\n");
      for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1;
          local_24 = local_24 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,local_24);
        iVar1 = Abc_ObjIsLatch(pAVar2);
        if (iVar1 != 0) {
          iVar1 = Abc_LatchInit(pAVar2);
          if (iVar1 == 1) {
            pAVar2 = Abc_ObjFanout0(pAVar2);
            pAVar2 = Abc_ObjFanout0(pAVar2);
            pcVar4 = Abc_ObjName(pAVar2);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            fprintf((FILE *)pFile,"    %s <= 1\'b0;\n",pcVar4);
          }
          else {
            iVar1 = Abc_LatchInit(pAVar2);
            if (iVar1 == 2) {
              pAVar2 = Abc_ObjFanout0(pAVar2);
              pAVar2 = Abc_ObjFanout0(pAVar2);
              pcVar4 = Abc_ObjName(pAVar2);
              pcVar4 = Io_WriteVerilogGetName(pcVar4);
              fprintf((FILE *)pFile,"    %s <= 1\'b1;\n",pcVar4);
            }
          }
        }
      }
      fprintf((FILE *)pFile,"  end\n");
    }
  }
  return;
}

Assistant:

void Io_WriteVerilogLatches( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch;
    int i;
    if ( Abc_NtkLatchNum(pNtk) == 0 )
        return;
    // write the latches
//    fprintf( pFile, "  always @(posedge %s) begin\n", Io_WriteVerilogGetName(Abc_ObjFanout0(Abc_NtkPi(pNtk,0))) );
//    fprintf( pFile, "  always begin\n" );
    fprintf( pFile, "  always @ (posedge clock) begin\n" );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        fprintf( pFile, "    %s", Io_WriteVerilogGetName(Abc_ObjName(Abc_ObjFanout0(Abc_ObjFanout0(pLatch)))) );
        fprintf( pFile, " <= %s;\n", Io_WriteVerilogGetName(Abc_ObjName(Abc_ObjFanin0(Abc_ObjFanin0(pLatch)))) );
    }
    fprintf( pFile, "  end\n" );
    // check if there are initial values
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        if ( Abc_LatchInit(pLatch) == ABC_INIT_ZERO || Abc_LatchInit(pLatch) == ABC_INIT_ONE )
            break;
    if ( i == Abc_NtkLatchNum(pNtk) )
        return;
    // write the initial values
    fprintf( pFile, "  initial begin\n" );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchInit(pLatch) == ABC_INIT_ZERO )
            fprintf( pFile, "    %s <= 1\'b0;\n", Io_WriteVerilogGetName(Abc_ObjName(Abc_ObjFanout0(Abc_ObjFanout0(pLatch)))) );
        else if ( Abc_LatchInit(pLatch) == ABC_INIT_ONE )
            fprintf( pFile, "    %s <= 1\'b1;\n", Io_WriteVerilogGetName(Abc_ObjName(Abc_ObjFanout0(Abc_ObjFanout0(pLatch)))) );
    }
    fprintf( pFile, "  end\n" );
}